

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O2

double duckdb::alp::AlpRDCompression<float,_true>::BuildLeftPartsDictionary<true>
                 (vector<unsigned_int,_true> *values,uint8_t right_bit_width,State *state)

{
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  *puVar1;
  uint16_t uVar2;
  uint *puVar3;
  __type_conflict8 __x;
  double dVar4;
  uint uVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  reference pvVar8;
  long lVar9;
  long lVar10;
  idx_t i;
  ulong uVar11;
  size_type __n;
  undefined7 in_register_00000031;
  uint *value;
  uint *puVar12;
  unsigned_long __x_00;
  __hashtable *__h;
  uint uVar13;
  __node_base *p_Var14;
  undefined1 auVar15 [16];
  uint left_tmp;
  State *local_a8;
  int local_9c;
  vector<duckdb::alp::AlpRDLeftPartInfo,_true> left_parts_sorted_repetitions;
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  left_parts_hash;
  
  local_9c = (int)CONCAT71(in_register_00000031,right_bit_width);
  left_parts_hash._M_h._M_buckets = &left_parts_hash._M_h._M_single_bucket;
  left_parts_hash._M_h._M_bucket_count = 1;
  p_Var14 = &left_parts_hash._M_h._M_before_begin;
  left_parts_hash._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  left_parts_hash._M_h._M_element_count = 0;
  left_parts_hash._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  left_parts_hash._M_h._M_rehash_policy._M_next_resize = 0;
  left_parts_hash._M_h._M_single_bucket = (__node_base_ptr)0x0;
  left_parts_sorted_repetitions.
  super_vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>.
  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  left_parts_sorted_repetitions.
  super_vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>.
  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  left_parts_sorted_repetitions.
  super_vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>.
  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (values->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_a8 = state;
  for (puVar12 = (values->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar12 != puVar3; puVar12 = puVar12 + 1) {
    left_tmp = *puVar12 >> ((byte)local_9c & 0x1f);
    pmVar6 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&left_parts_hash,&left_tmp);
    *pmVar6 = *pmVar6 + 1;
  }
  ::std::vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>::
  reserve(&left_parts_sorted_repetitions.
           super_vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
          ,left_parts_hash._M_h._M_element_count);
  while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
    ::std::vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>::
    emplace_back<int&,unsigned_int_const&>
              ((vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>
                *)&left_parts_sorted_repetitions,(int *)((long)(p_Var14 + 1) + 4),
               (uint *)(p_Var14 + 1));
  }
  ::std::
  __sort<__gnu_cxx::__normal_iterator<duckdb::alp::AlpRDLeftPartInfo*,std::vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::alp::AlpRDCompression<float,true>::BuildLeftPartsDictionary<true>(duckdb::vector<unsigned_int,true>const&,unsigned_char,duckdb::alp::AlpRDCompressionState<float,true>&)::_lambda(duckdb::alp::AlpRDLeftPartInfo_const&,duckdb::alp::AlpRDLeftPartInfo_const&)_1_>>
            (left_parts_sorted_repetitions.
             super_vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
             .
             super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
             ._M_impl.super__Vector_impl_data._M_start,
             left_parts_sorted_repetitions.
             super_vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
             .
             super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  uVar13 = 0;
  for (uVar11 = 8;
      uVar7 = (long)left_parts_sorted_repetitions.
                    super_vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    .
                    super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)left_parts_sorted_repetitions.
                    super_vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    .
                    super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4, uVar11 < uVar7;
      uVar11 = uVar11 + 1) {
    pvVar8 = vector<duckdb::alp::AlpRDLeftPartInfo,_true>::get<true>
                       (&left_parts_sorted_repetitions,uVar11);
    uVar13 = uVar13 + pvVar8->count;
  }
  __x_00 = 8;
  if (uVar7 < 8) {
    __x_00 = uVar7;
  }
  __x = ::std::log2<unsigned_long>(__x_00);
  puVar1 = &local_a8->left_parts_dict_map;
  for (__n = 0; __x_00 != __n; __n = __n + 1) {
    pvVar8 = vector<duckdb::alp::AlpRDLeftPartInfo,_true>::get<true>
                       (&left_parts_sorted_repetitions,__n);
    uVar2 = (uint16_t)pvVar8->hash;
    local_a8->left_parts_dict[__n] = uVar2;
    left_tmp = CONCAT22((short)__n,uVar2);
    ::std::
    _Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_short_const,unsigned_short>>
              ((_Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)puVar1,&left_tmp);
  }
  uVar11 = __x_00;
  while (uVar11 = uVar11 + 1,
        uVar11 < (ulong)((long)left_parts_sorted_repetitions.
                               super_vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                               .
                               super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)left_parts_sorted_repetitions.
                               super_vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                               .
                               super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    pvVar8 = vector<duckdb::alp::AlpRDLeftPartInfo,_true>::get<true>
                       (&left_parts_sorted_repetitions,uVar11);
    left_tmp = CONCAT22((short)uVar11,(short)pvVar8->hash);
    ::std::
    _Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_short_const,unsigned_short>>
              ((_Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)puVar1,&left_tmp);
  }
  dVar4 = ceil(__x);
  uVar5 = (int)dVar4 + (uint)((char)(int)dVar4 == '\0');
  local_a8->left_bit_width = (uint8_t)uVar5;
  local_a8->right_bit_width = (uint8_t)local_9c;
  local_a8->actual_dictionary_size = (uint8_t)__x_00;
  lVar9 = (long)(values->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(values->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar10 = lVar9 >> 2;
  auVar15._8_4_ = (int)(lVar9 >> 0x22);
  auVar15._0_8_ = lVar10;
  auVar15._12_4_ = 0x45300000;
  local_a8 = (State *)((double)((uVar13 & 0xffff) << 5) /
                       ((auVar15._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) +
                      (double)(int)((uVar5 & 0xff) + local_9c));
  ::std::
  _Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>::
  ~_Vector_base((_Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                 *)&left_parts_sorted_repetitions);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&left_parts_hash._M_h);
  return (double)local_a8;
}

Assistant:

static double BuildLeftPartsDictionary(const vector<EXACT_TYPE> &values, uint8_t right_bit_width, State &state) {
		unordered_map<EXACT_TYPE, int32_t> left_parts_hash;
		vector<AlpRDLeftPartInfo> left_parts_sorted_repetitions;

		// Building a hash for all the left parts and how many times they appear
		for (auto &value : values) {
			auto left_tmp = value >> right_bit_width;
			left_parts_hash[left_tmp]++;
		}

		// We build a vector from the hash to be able to sort it by repetition count
		left_parts_sorted_repetitions.reserve(left_parts_hash.size());
		for (auto &hash_pair : left_parts_hash) {
			left_parts_sorted_repetitions.emplace_back(hash_pair.second, hash_pair.first);
		}
		sort(left_parts_sorted_repetitions.begin(), left_parts_sorted_repetitions.end(),
		     [](const AlpRDLeftPartInfo &a, const AlpRDLeftPartInfo &b) { return a.count > b.count; });

		// Exceptions are left parts which do not fit in the fixed dictionary size
		uint32_t exceptions_count = 0;
		for (idx_t i = AlpRDConstants::MAX_DICTIONARY_SIZE; i < left_parts_sorted_repetitions.size(); i++) {
			exceptions_count += left_parts_sorted_repetitions[i].count;
		}

		// The left parts bit width after compression is determined by how many elements are in the dictionary
		uint64_t actual_dictionary_size =
		    MinValue<uint64_t>(AlpRDConstants::MAX_DICTIONARY_SIZE, left_parts_sorted_repetitions.size());
		uint8_t left_bit_width =
		    MaxValue<uint8_t>(1, ExactNumericCast<uint8_t>(std::ceil(std::log2(actual_dictionary_size))));

		if (PERSIST_DICT) {
			for (idx_t dict_idx = 0; dict_idx < actual_dictionary_size; dict_idx++) {
				//! The dict keys are mapped to the left part themselves
				state.left_parts_dict[dict_idx] =
				    UnsafeNumericCast<uint16_t>(left_parts_sorted_repetitions[dict_idx].hash);
				state.left_parts_dict_map.insert({state.left_parts_dict[dict_idx], dict_idx});
			}
			//! Pararelly we store a map of the dictionary to quickly resolve exceptions during encoding
			for (idx_t i = actual_dictionary_size + 1; i < left_parts_sorted_repetitions.size(); i++) {
				state.left_parts_dict_map.insert({left_parts_sorted_repetitions[i].hash, i});
			}
			state.left_bit_width = left_bit_width;
			state.right_bit_width = right_bit_width;
			state.actual_dictionary_size = UnsafeNumericCast<uint8_t>(actual_dictionary_size);

			D_ASSERT(state.left_bit_width > 0 && state.right_bit_width > 0 &&
			         state.left_bit_width <= AlpRDConstants::MAX_DICTIONARY_BIT_WIDTH &&
			         state.actual_dictionary_size <= AlpRDConstants::MAX_DICTIONARY_SIZE);
		}

		double estimated_size = EstimateCompressionSize(right_bit_width, left_bit_width,
		                                                UnsafeNumericCast<uint16_t>(exceptions_count), values.size());
		return estimated_size;
	}